

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O2

int32_t __thiscall icu_63::CollationRuleParser::skipWhiteSpace(CollationRuleParser *this,int32_t i)

{
  short sVar1;
  UnicodeString *this_00;
  UBool UVar2;
  char16_t cVar3;
  int32_t iVar4;
  
  while( true ) {
    this_00 = this->rules;
    sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this_00->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    if (iVar4 <= i) break;
    cVar3 = UnicodeString::doCharAt(this_00,i);
    UVar2 = PatternProps::isWhiteSpace((uint)(ushort)cVar3);
    if (UVar2 == '\0') {
      return i;
    }
    i = i + 1;
  }
  return i;
}

Assistant:

int32_t
CollationRuleParser::skipWhiteSpace(int32_t i) const {
    while(i < rules->length() && PatternProps::isWhiteSpace(rules->charAt(i))) {
        ++i;
    }
    return i;
}